

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling.c
# Opt level: O0

int16_t calc_average_fixed16(pooling_calc_context_t calc)

{
  pooling_calc_context_t pVar1;
  undefined1 auVar2 [28];
  int16_t iVar3;
  int32_t iVar4;
  int iVar5;
  int iVar6;
  int in_stack_00000008;
  int in_stack_0000000c;
  int local_2c;
  int local_28;
  int kx;
  int jx_1;
  int ix_1;
  int jx;
  int ix;
  int16_t *x;
  int16_t average_val;
  int32_t val;
  
  pVar1 = calc;
  auVar2 = (undefined1  [28])calc._0_28_;
  x._4_4_ = 0;
  calc._0_28_ = auVar2;
  if (calc.wstride == 2) {
    if ((char)calc.offset_x == '\0') {
      iVar5 = calc.hend - calc.hstart;
      calc.hstride = (in_stack_0000000c - in_stack_00000008) * iVar5;
      auVar2 = (undefined1  [28])calc._0_28_;
    }
    calc._0_28_ = auVar2;
    for (ix_1 = in_stack_00000008; auVar2 = (undefined1  [28])calc._0_28_, ix_1 < in_stack_0000000c;
        ix_1 = ix_1 + 1) {
      for (jx_1 = ix_1 * calc.dstart + calc.hstart; jx_1 < ix_1 * calc.dstart + calc.hend;
          jx_1 = jx_1 + 1) {
        x._4_4_ = *(short *)(*(long *)(calc._32_8_ + 0x18) + (long)jx_1 * 2 +
                            (ulong)(uint)calc.set_y * 2) + x._4_4_;
      }
    }
  }
  else if (calc.wstride == 3) {
    if ((char)calc.offset_x == '\0') {
      iVar5 = calc.hend - calc.hstart;
      iVar6 = calc.wend - calc.wstart;
      calc.hstride = (in_stack_0000000c - in_stack_00000008) * iVar5 * iVar6;
      auVar2 = (undefined1  [28])calc._0_28_;
    }
    calc._0_28_ = auVar2;
    for (kx = in_stack_00000008; auVar2 = (undefined1  [28])calc._0_28_, kx < in_stack_0000000c;
        kx = kx + 1) {
      for (local_28 = calc.hstart; local_28 < calc.hend; local_28 = local_28 + 1) {
        for (local_2c = calc.wstart; local_2c < calc.wend; local_2c = local_2c + 1) {
          x._4_4_ = *(short *)(*(long *)(calc._32_8_ + 0x18) + (long)(kx * calc.dstart) * 2 +
                               (long)(local_28 * calc.dend) * 2 + (long)local_2c * 2 +
                              (ulong)(uint)calc.set_y * 2) + x._4_4_;
        }
      }
    }
  }
  calc._0_28_ = auVar2;
  calc.get_x = pVar1.get_x;
  iVar4 = rescale_scalar_fixed32
                    ((int)(short)(x._4_4_ / calc.hstride),(uint)(*(byte *)(calc._32_8_ + 0x10) >> 4)
                     ,(uint)((byte)calc.get_x[0x10] >> 4));
  iVar3 = saturate32_to_16((int)(short)iVar4);
  return iVar3;
}

Assistant:

int16_t calc_average_fixed16(pooling_calc_context_t calc) {
  int32_t val = 0;
  int16_t average_val = 0;
  int16_t *x = (int16_t *)(calc.x->data);
  if (calc.kernel_size == 2) {
    if (!calc.including_pad) {
      calc.pool_size = (calc.hend - calc.hstart) * (calc.wend - calc.wstart);
    }
    for (int ix = calc.hstart; ix < calc.hend; ix++) {
      for (int jx = ix * calc.hstride + calc.wstart;
           jx < ix * calc.hstride + calc.wend; jx++) {
        val += *(x + jx + calc.offset_x);
      }
    }
  } else if (calc.kernel_size == 3) {
    if (!calc.including_pad) {
      calc.pool_size = (calc.hend - calc.hstart) * (calc.wend - calc.wstart) *
                       (calc.dend - calc.dstart);
    }
    for (int ix = calc.hstart; ix < calc.hend; ix++) {
      for (int jx = calc.wstart; jx < calc.wend; jx++) {
        for (int kx = calc.dstart; kx < calc.dend; kx++) {
          val +=
              *(x + ix * calc.hstride + jx * calc.wstride + kx + calc.offset_x);
        }
      }
    }
  }
  average_val = val / calc.pool_size;
  average_val =
      rescale_scalar_fixed32(average_val, calc.x->fp_pos, calc.y->fp_pos);
  average_val = saturate32_to_16(average_val);
  return average_val;
}